

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O1

void __thiscall
cmDebugServerConsole::OnWatchpoint
          (cmDebugServerConsole *this,string *variable,int access,string *newValue)

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Watchpoint \'",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(variable->_M_dataplus)._M_p,variable->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' hit -- \'",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(newValue->_M_dataplus)._M_p,newValue->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' (",3);
  __s = cmVariableWatch::GetAccessAsString(access);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,PROMPT_abi_cxx11_._M_dataplus._M_p,PROMPT_abi_cxx11_._M_string_length);
  std::__cxx11::stringbuf::str();
  cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return;
}

Assistant:

void cmDebugServerConsole::OnWatchpoint(const std::string& variable,
                                        int access,
                                        const std::string& newValue)
{
  std::stringstream ss;
  ss << "Watchpoint '" << variable << "' hit -- '" << newValue << "' ("
     << cmVariableWatch::GetAccessAsString(access) << ")" << std::endl
     << PROMPT;

  AsyncBroadcast(ss.str());
}